

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

void Bac_ManMarkNodesGia(Bac_Man_t *p,Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  
  uVar2 = (p->vBuf2LeafNtk).nSize;
  if (uVar2 != pGia->nBufs) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x118,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  pGVar5 = pGia->pObjs;
  pGVar5->Value = 1;
  iVar3 = pGia->nRegs;
  pVVar6 = pGia->vCis;
  uVar8 = pVVar6->nSize;
  if (uVar8 - iVar3 == 0 || (int)uVar8 < iVar3) {
    uVar7 = pGia->nObjs;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
      goto LAB_008abaa6;
    }
  }
  else {
    uVar10 = 0;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    do {
      if (uVar9 == uVar10) goto LAB_008abb43;
      iVar4 = pVVar6->pArray[uVar10];
      if (((long)iVar4 < 0) || (uVar7 = pGia->nObjs, (int)uVar7 <= iVar4)) goto LAB_008abb24;
      pGVar5[iVar4].Value = 1;
      uVar10 = uVar10 + 1;
    } while (uVar8 - iVar3 != uVar10);
  }
  uVar9 = (ulong)uVar7;
  puVar11 = &pGVar5->Value;
  uVar8 = 0;
  do {
    uVar10 = *(ulong *)(puVar11 + -2);
    if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar10) {
      uVar12 = (uint)uVar10 & 0x1fffffff;
      uVar13 = (uint)(uVar10 >> 0x20);
      if (uVar12 == 0x1fffffff || uVar12 != (uVar13 & 0x1fffffff)) {
        uVar12 = *(uint *)((long)puVar11 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
        *puVar11 = uVar12;
        if (uVar12 != *(uint *)((long)puVar11 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3)) {
          __assert_fail("pObj->Value == Gia_ObjFanin1(pObj)->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,0x123,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
        }
      }
      else {
        if (((int)uVar8 < 0) || ((int)uVar2 <= (int)uVar8)) goto LAB_008abb43;
        uVar10 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        *puVar11 = (p->vBuf2LeafNtk).pArray[uVar10];
      }
    }
    puVar11 = puVar11 + 3;
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
LAB_008abaa6:
  if (uVar8 != uVar2) {
    __assert_fail("Count == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x126,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  pVVar6 = pGia->vCos;
  uVar2 = pVVar6->nSize;
  if (uVar2 - iVar3 != 0 && iVar3 <= (int)uVar2) {
    uVar10 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar10;
    }
    do {
      if (uVar9 == uVar10) {
LAB_008abb43:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar6->pArray[uVar10];
      if (((long)iVar4 < 0) || ((int)uVar7 <= iVar4)) {
LAB_008abb24:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = pGVar5 + iVar4;
      if (pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value != 1) {
        __assert_fail("Gia_ObjFanin0(pObj)->Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0x129,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
      }
      pGVar1->Value = 1;
      uVar10 = uVar10 + 1;
    } while (uVar2 - iVar3 != uVar10);
  }
  return;
}

Assistant:

void Bac_ManMarkNodesGia( Bac_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj; int i, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia) );
    Gia_ManConst0(pGia)->Value = 1;
    Gia_ManForEachPi( pGia, pObj, i )
        pObj->Value = 1;
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else
        {
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value == Gia_ObjFanin1(pObj)->Value );
        }
    }
    assert( Count == Gia_ManBufNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
    {
        assert( Gia_ObjFanin0(pObj)->Value == 1 );
        pObj->Value = 1;
    }
}